

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O2

Config * ProgramOptions::parseCommandLine(Config *__return_storage_ptr__,int argc,char **argv)

{
  Config *pCVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  pointer pbVar4;
  bool bVar5;
  Color CVar6;
  int iVar7;
  OptionAdder *pOVar8;
  size_t sVar9;
  ostream *poVar10;
  runtime_error *this;
  DataFormat DVar11;
  KerningPairs KVar12;
  code *pcVar13;
  TextureNameSuffix TVar14;
  pointer_____offset_0x10___ *ppuVar15;
  size_type sVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  string *fileName;
  allocator local_139e;
  allocator local_139d;
  allocator local_139c;
  allocator local_139b;
  allocator local_139a;
  allocator local_1399;
  allocator local_1398;
  allocator local_1397;
  allocator local_1396;
  allocator local_1395;
  allocator local_1394;
  allocator local_1393;
  allocator local_1392;
  allocator local_1391;
  allocator local_1390;
  allocator local_138f;
  allocator local_138e;
  allocator local_138d;
  allocator local_138c;
  allocator local_138b;
  allocator local_138a;
  allocator local_1389;
  allocator local_1388;
  allocator local_1387;
  allocator local_1386;
  allocator local_1385;
  allocator local_1384;
  allocator local_1383;
  allocator local_1382;
  allocator local_1381;
  allocator local_1380;
  allocator local_137f;
  allocator local_137e;
  allocator local_137d;
  allocator local_137c;
  allocator local_137b;
  allocator local_137a;
  allocator local_1379;
  allocator local_1378;
  allocator local_1377;
  allocator local_1376;
  allocator local_1375;
  allocator local_1374;
  allocator local_1373;
  allocator local_1372;
  allocator local_1371;
  allocator local_1370;
  allocator local_136f;
  allocator local_136e;
  allocator local_136d;
  allocator local_136c;
  allocator local_136b;
  allocator local_136a;
  allocator local_1369;
  allocator local_1368;
  allocator local_1367;
  allocator local_1366;
  allocator local_1365;
  allocator local_1364;
  allocator local_1363;
  allocator local_1362;
  allocator local_1361;
  allocator local_1360;
  allocator local_135f;
  allocator local_135e;
  allocator local_135d;
  allocator local_135c;
  allocator local_135b;
  allocator local_135a;
  allocator local_1359;
  allocator local_1358;
  allocator local_1357;
  allocator local_1356;
  allocator local_1355;
  allocator local_1354;
  allocator local_1353;
  allocator local_1352;
  allocator local_1351;
  allocator local_1350;
  allocator local_134f;
  allocator local_134e;
  allocator local_134d;
  allocator local_134c;
  allocator local_134b;
  allocator local_134a;
  allocator local_1349;
  element_type *local_1348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1340;
  Config *local_1338;
  uint32_t *local_1330;
  string local_1328;
  string dataFormat;
  string kerningPairs;
  undefined1 local_12c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12b8;
  _Base_ptr local_12a8;
  size_t sStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined4 local_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined8 local_1268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  charsFile;
  element_type *local_1238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1230;
  element_type *local_1228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1220;
  shared_ptr<const_cxxopts::Value> local_1218;
  element_type *local_1208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1200;
  shared_ptr<const_cxxopts::Value> local_11f8;
  element_type *local_11e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_11e0;
  shared_ptr<const_cxxopts::Value> local_11d8;
  element_type *local_11c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_11c0;
  shared_ptr<const_cxxopts::Value> local_11b8;
  element_type *local_11a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_11a0;
  shared_ptr<const_cxxopts::Value> local_1198;
  element_type *local_1188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1180;
  shared_ptr<const_cxxopts::Value> local_1178;
  element_type *local_1168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1160;
  shared_ptr<const_cxxopts::Value> local_1158;
  element_type *local_1148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1140;
  shared_ptr<const_cxxopts::Value> local_1138;
  element_type *local_1128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1120;
  shared_ptr<const_cxxopts::Value> local_1118;
  element_type *local_1108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1100;
  shared_ptr<const_cxxopts::Value> local_10f8;
  element_type *local_10e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10e0;
  shared_ptr<const_cxxopts::Value> local_10d8;
  element_type *local_10c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10c0;
  shared_ptr<const_cxxopts::Value> local_10b8;
  element_type *local_10a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10a0;
  shared_ptr<const_cxxopts::Value> local_1098;
  element_type *local_1088;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1080;
  shared_ptr<const_cxxopts::Value> local_1078;
  element_type *local_1068;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1060;
  shared_ptr<const_cxxopts::Value> local_1058;
  element_type *local_1048;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1040;
  shared_ptr<const_cxxopts::Value> local_1038;
  element_type *local_1028;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1020;
  shared_ptr<const_cxxopts::Value> local_1018;
  element_type *local_1008;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1000;
  shared_ptr<const_cxxopts::Value> local_ff8;
  element_type *local_fe8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_fe0;
  shared_ptr<const_cxxopts::Value> local_fd8;
  element_type *local_fc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_fc0;
  shared_ptr<const_cxxopts::Value> local_fb8;
  shared_ptr<const_cxxopts::Value> local_fa8;
  element_type *local_f98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f90;
  shared_ptr<const_cxxopts::Value> local_f88;
  element_type *local_f78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f70;
  shared_ptr<const_cxxopts::Value> local_f68;
  Alignment *local_f50;
  long *local_f48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f40;
  long *local_f38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f30;
  long *local_f28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f20;
  long *local_f18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f10;
  long *local_f08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f00;
  long *local_ef8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ef0;
  long *local_ee8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ee0;
  long *local_ed8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ed0;
  long *local_ec8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ec0;
  long *local_eb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_eb0;
  long *local_ea8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ea0;
  string textureNameSuffix;
  string charsFileOptionName;
  string chars;
  string textureSizeListOptionName;
  string charsOptionName;
  string backgroundColorOptionName;
  string backgroundColor;
  string textureSizeList;
  string color;
  element_type *local_d78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d70;
  shared_ptr<const_cxxopts::Value> local_d68;
  shared_ptr<const_cxxopts::Value> local_d58;
  element_type *local_d48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d40;
  shared_ptr<const_cxxopts::Value> local_d38;
  string local_d28;
  string local_d08;
  string local_ce8 [32];
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928 [32];
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8 [32];
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8 [32];
  string local_7a8;
  string local_788;
  string local_768;
  string local_748 [32];
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8 [32];
  string local_6a8;
  string local_688;
  string local_668;
  string local_648 [32];
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8 [32];
  string local_5a8;
  string local_588;
  string local_568;
  string local_548 [32];
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8 [32];
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408 [32];
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  ParseResult result;
  Options options;
  
  Config::Config(__return_storage_ptr__);
  chars._M_dataplus._M_p = (pointer)&chars.field_2;
  chars._M_string_length = 0;
  charsFile.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  color._M_dataplus._M_p = (pointer)&color.field_2;
  color._M_string_length = 0;
  chars.field_2._M_local_buf[0] = '\0';
  color.field_2._M_local_buf[0] = '\0';
  textureSizeList._M_dataplus._M_p = (pointer)&textureSizeList.field_2;
  textureSizeList._M_string_length = 0;
  charsFile.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  charsFile.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  textureSizeList.field_2._M_local_buf[0] = '\0';
  backgroundColor._M_dataplus._M_p = (pointer)&backgroundColor.field_2;
  backgroundColor._M_string_length = 0;
  backgroundColor.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&backgroundColorOptionName,"background-color",(allocator *)&options);
  std::__cxx11::string::string((string *)&charsFileOptionName,"chars-file",(allocator *)&options);
  std::__cxx11::string::string((string *)&charsOptionName,"chars",(allocator *)&options);
  std::__cxx11::string::string
            ((string *)&textureSizeListOptionName,"texture-size",(allocator *)&options);
  dataFormat._M_dataplus._M_p = (pointer)&dataFormat.field_2;
  dataFormat._M_string_length = 0;
  kerningPairs._M_dataplus._M_p = (pointer)&kerningPairs.field_2;
  kerningPairs._M_string_length = 0;
  dataFormat.field_2._M_local_buf[0] = '\0';
  kerningPairs.field_2._M_local_buf[0] = '\0';
  textureNameSuffix._M_dataplus._M_p = (pointer)&textureNameSuffix.field_2;
  textureNameSuffix._M_string_length = 0;
  textureNameSuffix.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_268,"fontbm",(allocator *)&result);
  std::__cxx11::string::string
            ((string *)&local_288,"Command line bitmap font generator, compatible with bmfont",
             (allocator *)local_12c8);
  cxxopts::Options::Options(&options,&local_268,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::string((string *)&local_2a8,"",&local_1349);
  cxxopts::Options::add_options((OptionAdder *)&result,&options,&local_2a8);
  std::__cxx11::string::string((string *)local_12c8,"help",&local_134a);
  std::__cxx11::string::string((string *)&local_1328,"produce help message",&local_134b);
  cxxopts::value<bool>();
  local_f68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f78;
  local_f68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f70._M_pi;
  local_f78 = (element_type *)0x0;
  _Stack_f70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_2c8,"",&local_134c);
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&result,(string *)local_12c8,&local_1328,&local_f68,&local_2c8)
  ;
  std::__cxx11::string::string((string *)&local_2e8,"font-file",&local_134d);
  std::__cxx11::string::string((string *)&local_308,"path to ttf file, required",&local_134e);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_f98,&__return_storage_ptr__->fontFile);
  local_f88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f98;
  local_f88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_f90._M_pi;
  local_f98 = (element_type *)0x0;
  _Stack_f90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_328,"",&local_134f);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_2e8,&local_308,&local_f88,&local_328);
  std::__cxx11::string::string
            ((string *)&local_348,
             "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if \'chars-file\' option is not defined"
             ,&local_1350);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_1348,&chars);
  local_fa8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1348
  ;
  local_fa8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1340._M_pi;
  local_1348 = (element_type *)0x0;
  _Stack_1340._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_368,"",&local_1351);
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,&charsOptionName,&local_348,&local_fa8,&local_368);
  std::__cxx11::string::string
            ((string *)&local_388,
             "optional path to UTF-8 text file with required characters (will be combined with \'chars\' option)"
             ,&local_1352);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((cxxopts *)&local_fc8,&charsFile);
  local_fb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_fc8;
  local_fb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_fc0._M_pi;
  local_fc8 = (element_type *)0x0;
  _Stack_fc0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_3a8,"",&local_1353);
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,&charsFileOptionName,&local_388,&local_fb8,&local_3a8);
  std::__cxx11::string::string((string *)&local_3c8,"color",&local_1354);
  std::__cxx11::string::string
            ((string *)&local_3e8,
             "foreground RGB color, for example: 32,255,255, default value is 255,255,255",
             &local_1355);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_ea8,&color);
  local_1338 = __return_storage_ptr__;
  std::__cxx11::string::string(local_408,"255,255,255",&local_1356);
  (**(code **)(*local_ea8 + 0x50))(&local_fe8,local_ea8,local_408);
  local_fd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_fe8;
  local_fd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_fe0._M_pi;
  local_fe8 = (element_type *)0x0;
  _Stack_fe0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_428,"",&local_1357);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_3c8,&local_3e8,&local_fd8,&local_428);
  std::__cxx11::string::string
            ((string *)&local_448,
             "background color RGB color, for example: 0,0,128, transparent by default",&local_1358)
  ;
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_1008,&backgroundColor);
  local_ff8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1008
  ;
  local_ff8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1000._M_pi;
  local_1008 = (element_type *)0x0;
  _Stack_1000._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_468,"",&local_1359);
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,&backgroundColorOptionName,&local_448,&local_ff8,&local_468);
  std::__cxx11::string::string((string *)&local_488,"font-size",&local_135a);
  std::__cxx11::string::string((string *)&local_4a8,"font size, default value is 32",&local_135b);
  cxxopts::value<unsigned_short>((cxxopts *)&local_eb8,&__return_storage_ptr__->fontSize);
  std::__cxx11::string::string(local_4c8,"32",&local_135c);
  (**(code **)(*local_eb8 + 0x50))(&local_1028,local_eb8,local_4c8);
  local_1018.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1028;
  local_1018.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1020._M_pi;
  local_1028 = (element_type *)0x0;
  _Stack_1020._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_4e8,"",&local_135d);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_488,&local_4a8,&local_1018,&local_4e8);
  std::__cxx11::string::string((string *)&local_508,"padding-up",&local_135e);
  std::__cxx11::string::string((string *)&local_528,"padding up, default value is 0",&local_135f);
  cxxopts::value<unsigned_int>((cxxopts *)&local_ec8,&(__return_storage_ptr__->padding).up);
  std::__cxx11::string::string(local_548,"0",&local_1360);
  (**(code **)(*local_ec8 + 0x50))(&local_1048,local_ec8,local_548);
  local_1038.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1048;
  local_1038.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1040._M_pi;
  local_1048 = (element_type *)0x0;
  _Stack_1040._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_568,"",&local_1361);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_508,&local_528,&local_1038,&local_568);
  std::__cxx11::string::string((string *)&local_588,"padding-right",&local_1362);
  std::__cxx11::string::string((string *)&local_5a8,"padding right, default value is 0",&local_1363)
  ;
  cxxopts::value<unsigned_int>((cxxopts *)&local_ed8,&(__return_storage_ptr__->padding).right);
  std::__cxx11::string::string(local_5c8,"0",&local_1364);
  (**(code **)(*local_ed8 + 0x50))(&local_1068,local_ed8,local_5c8);
  local_1058.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1068;
  local_1058.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1060._M_pi;
  local_1068 = (element_type *)0x0;
  _Stack_1060._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_5e8,"",&local_1365);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_588,&local_5a8,&local_1058,&local_5e8);
  std::__cxx11::string::string((string *)&local_608,"padding-down",&local_1366);
  std::__cxx11::string::string((string *)&local_628,"padding down, default value is 0",&local_1367);
  cxxopts::value<unsigned_int>((cxxopts *)&local_ee8,&(__return_storage_ptr__->padding).down);
  std::__cxx11::string::string(local_648,"0",&local_1368);
  (**(code **)(*local_ee8 + 0x50))(&local_1088,local_ee8,local_648);
  local_1078.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1088;
  local_1078.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1080._M_pi;
  local_1088 = (element_type *)0x0;
  _Stack_1080._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_668,"",&local_1369);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_608,&local_628,&local_1078,&local_668);
  std::__cxx11::string::string((string *)&local_688,"padding-left",&local_136a);
  std::__cxx11::string::string((string *)&local_6a8,"padding left, default value is 0",&local_136b);
  cxxopts::value<unsigned_int>((cxxopts *)&local_ef8,&(__return_storage_ptr__->padding).left);
  std::__cxx11::string::string(local_6c8,"0",&local_136c);
  (**(code **)(*local_ef8 + 0x50))(&local_10a8,local_ef8,local_6c8);
  local_1098.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_10a8;
  local_1098.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_10a0._M_pi;
  local_10a8 = (element_type *)0x0;
  _Stack_10a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_6e8,"",&local_136d);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_688,&local_6a8,&local_1098,&local_6e8);
  std::__cxx11::string::string((string *)&local_708,"spacing-vert",&local_136e);
  std::__cxx11::string::string((string *)&local_728,"spacing vert, default value is 0",&local_136f);
  cxxopts::value<unsigned_int>((cxxopts *)&local_f08,&(__return_storage_ptr__->spacing).ver);
  std::__cxx11::string::string(local_748,"0",&local_1370);
  (**(code **)(*local_f08 + 0x50))(&local_10c8,local_f08,local_748);
  local_10b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_10c8;
  local_10b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_10c0._M_pi;
  local_10c8 = (element_type *)0x0;
  _Stack_10c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_768,"",&local_1371);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_708,&local_728,&local_10b8,&local_768);
  std::__cxx11::string::string((string *)&local_788,"spacing-horiz",&local_1372);
  std::__cxx11::string::string((string *)&local_7a8,"spacing horiz, default value is 0",&local_1373)
  ;
  cxxopts::value<unsigned_int>((cxxopts *)&local_f18,&(__return_storage_ptr__->spacing).hor);
  std::__cxx11::string::string(local_7c8,"0",&local_1374);
  (**(code **)(*local_f18 + 0x50))(&local_10e8,local_f18,local_7c8);
  local_10d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_10e8;
  local_10d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_10e0._M_pi;
  local_10e8 = (element_type *)0x0;
  _Stack_10e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_7e8,"",&local_1375);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_788,&local_7a8,&local_10d8,&local_7e8);
  std::__cxx11::string::string((string *)&local_808,"output",&local_1376);
  std::__cxx11::string::string
            ((string *)&local_828,"output files name without extension, required",&local_1377);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_1108,&__return_storage_ptr__->output);
  local_10f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1108;
  local_10f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1100._M_pi;
  local_1108 = (element_type *)0x0;
  _Stack_1100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_848,"",&local_1378);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_808,&local_828,&local_10f8,&local_848);
  std::__cxx11::string::string((string *)&local_868,"data-format",&local_1379);
  std::__cxx11::string::string
            ((string *)&local_888,
             "output data file format: \"txt\", \"xml\", \"json\", \"bin\", \"cbor\", default: \"txt\""
             ,&local_137a);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_f28,&dataFormat);
  std::__cxx11::string::string(local_8a8,"txt",&local_137b);
  (**(code **)(*local_f28 + 0x50))(&local_1128,local_f28,local_8a8);
  local_1118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1128;
  local_1118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1120._M_pi;
  local_1128 = (element_type *)0x0;
  _Stack_1120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_8c8,"",&local_137c);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_868,&local_888,&local_1118,&local_8c8);
  std::__cxx11::string::string((string *)&local_8e8,"kerning-pairs",&local_137d);
  std::__cxx11::string::string
            ((string *)&local_908,
             "\"generate kerning pairs: \"disabled\", \"basic\", \"regular\" (tuned by hinter), \"extended\" (bigger output size, but more precise), default: \"disabled\""
             ,&local_137e);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_f38,&kerningPairs);
  std::__cxx11::string::string(local_928,"disabled",&local_137f);
  (**(code **)(*local_f38 + 0x50))(&local_1148,local_f38,local_928);
  local_1138.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1148;
  local_1138.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1140._M_pi;
  local_1148 = (element_type *)0x0;
  _Stack_1140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_948,"",&local_1380);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_8e8,&local_908,&local_1138,&local_948);
  std::__cxx11::string::string((string *)&local_968,"monochrome",&local_1381);
  std::__cxx11::string::string((string *)&local_988,"disable anti-aliasing",&local_1382);
  cxxopts::value<bool>((cxxopts *)&local_1168,&__return_storage_ptr__->monochrome);
  local_1158.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1168;
  local_1158.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1160._M_pi;
  local_1168 = (element_type *)0x0;
  _Stack_1160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_9a8,"",&local_1383);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_968,&local_988,&local_1158,&local_9a8);
  std::__cxx11::string::string((string *)&local_9c8,"extra-info",&local_1384);
  std::__cxx11::string::string
            ((string *)&local_9e8,"write extra information to data file",&local_1385);
  cxxopts::value<bool>((cxxopts *)&local_1188,&__return_storage_ptr__->extraInfo);
  local_1178.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1188;
  local_1178.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1180._M_pi;
  local_1188 = (element_type *)0x0;
  _Stack_1180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_a08,"",&local_1386);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_9c8,&local_9e8,&local_1178,&local_a08);
  std::__cxx11::string::string
            ((string *)&local_a28,
             "list of texture sizes (will be tried from left to right to fit glyphs)",&local_1387);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_11a8,&textureSizeList);
  local_1198.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_11a8;
  local_1198.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_11a0._M_pi;
  local_11a8 = (element_type *)0x0;
  _Stack_11a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_a48,"",&local_1388);
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,&textureSizeListOptionName,&local_a28,&local_1198,&local_a48);
  std::__cxx11::string::string((string *)&local_a68,"texture-crop-width",&local_1389);
  std::__cxx11::string::string
            ((string *)&local_a88,"crop unused parts of output textures (width)",&local_138a);
  cxxopts::value<bool>((cxxopts *)&local_11c8,&__return_storage_ptr__->cropTexturesWidth);
  local_11b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_11c8;
  local_11b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_11c0._M_pi;
  local_11c8 = (element_type *)0x0;
  _Stack_11c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_aa8,"",&local_138b);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_a68,&local_a88,&local_11b8,&local_aa8);
  std::__cxx11::string::string((string *)&local_ac8,"texture-crop-height",&local_138c);
  std::__cxx11::string::string
            ((string *)&local_ae8,"crop unused parts of output textures (height)",&local_138d);
  cxxopts::value<bool>((cxxopts *)&local_11e8,&__return_storage_ptr__->cropTexturesHeight);
  local_11d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_11e8;
  local_11d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_11e0._M_pi;
  local_11e8 = (element_type *)0x0;
  _Stack_11e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_b08,"",&local_138e);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_ac8,&local_ae8,&local_11d8,&local_b08);
  std::__cxx11::string::string((string *)&local_b28,"align-horiz",&local_138f);
  std::__cxx11::string::string((string *)&local_b48,"align glyph horizontal position",&local_1390);
  local_1330 = &(__return_storage_ptr__->alignment).hor;
  cxxopts::value<unsigned_int>((cxxopts *)&local_1208,local_1330);
  local_11f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1208;
  local_11f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1200._M_pi;
  local_1208 = (element_type *)0x0;
  _Stack_1200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_b68,"",&local_1391);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_b28,&local_b48,&local_11f8,&local_b68);
  std::__cxx11::string::string((string *)&local_b88,"align-vert",&local_1392);
  std::__cxx11::string::string((string *)&local_ba8,"align glyph vertical position",&local_1393);
  local_f50 = &__return_storage_ptr__->alignment;
  cxxopts::value<unsigned_int>((cxxopts *)&local_1228,&local_f50->ver);
  local_1218.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1228;
  local_1218.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1220._M_pi;
  local_1228 = (element_type *)0x0;
  _Stack_1220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_bc8,"",&local_1394);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_b88,&local_ba8,&local_1218,&local_bc8);
  std::__cxx11::string::string((string *)&local_be8,"verbose",&local_1395);
  std::__cxx11::string::string((string *)&local_c08,"verbose output",&local_1396);
  cxxopts::value<bool>((cxxopts *)&local_d48,&__return_storage_ptr__->verbose);
  local_d38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d48;
  local_d38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d40._M_pi;
  local_d48 = (element_type *)0x0;
  _Stack_d40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_c28,"",&local_1397);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_be8,&local_c08,&local_d38,&local_c28);
  std::__cxx11::string::string((string *)&local_c48,"max-texture-count",&local_1398);
  std::__cxx11::string::string((string *)&local_c68,"maximum generated textures",&local_1399);
  cxxopts::value<unsigned_int>((cxxopts *)&local_1238,&local_1338->maxTextureCount);
  local_d58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1238
  ;
  local_d58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_1230._M_pi;
  local_1238 = (element_type *)0x0;
  _Stack_1230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_c88,"",&local_139a);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_c48,&local_c68,&local_d58,&local_c88);
  std::__cxx11::string::string((string *)&local_ca8,"texture-name-suffix",&local_139b);
  std::__cxx11::string::string
            ((string *)&local_cc8,
             "texture name suffix: \"index_aligned\", \"index\", \"none\", default: \"index_aligned\""
             ,&local_139c);
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_f48,&textureNameSuffix);
  std::__cxx11::string::string(local_ce8,"index_aligned",&local_139d);
  (**(code **)(*local_f48 + 0x50))(&local_d78,local_f48,local_ce8);
  local_d68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d78;
  local_d68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d70._M_pi;
  local_d78 = (element_type *)0x0;
  _Stack_d70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_d08,"",&local_139e);
  cxxopts::OptionAdder::operator()(pOVar8,&local_ca8,&local_cc8,&local_d68,&local_d08);
  std::__cxx11::string::~string((string *)&local_d08);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_d68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d70);
  std::__cxx11::string::~string(local_ce8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f40);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_c88);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_d58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1230);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::~string((string *)&local_c28);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_d38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d40);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_bc8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1218.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1220);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::__cxx11::string::~string((string *)&local_b88);
  std::__cxx11::string::~string((string *)&local_b68);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_11f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1200);
  std::__cxx11::string::~string((string *)&local_b48);
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string((string *)&local_b08);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_11d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_11e0);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_aa8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_11b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_11c0);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a48);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1198.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_11a0);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_a08);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1178.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1180);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9a8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1158.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1160);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1138.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1140);
  std::__cxx11::string::~string(local_928);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f30);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1120);
  std::__cxx11::string::~string(local_8a8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f20);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_848);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_10f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1100);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_10d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10e0);
  std::__cxx11::string::~string(local_7c8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f10);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_10b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10c0);
  std::__cxx11::string::~string(local_748);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f00);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1098.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10a0);
  std::__cxx11::string::~string(local_6c8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ef0);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_668);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1078.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1080);
  std::__cxx11::string::~string(local_648);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ee0);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1058.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1060);
  std::__cxx11::string::~string(local_5c8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ed0);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_568);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1038.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1040);
  std::__cxx11::string::~string(local_548);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ec0);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1018.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1020);
  std::__cxx11::string::~string(local_4c8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_eb0);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_ff8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1000);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_fd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_fe0);
  std::__cxx11::string::~string(local_408);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ea0);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_fb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_fc0);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_fa8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1340);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_f88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f90);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_f68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f70);
  std::__cxx11::string::~string((string *)&local_1328);
  std::__cxx11::string::~string((string *)local_12c8);
  std::__cxx11::string::~string((string *)&result.m_keys._M_h._M_bucket_count);
  std::__cxx11::string::~string((string *)&local_2a8);
  cxxopts::Options::parse(&result,&options,argc,argv);
  pCVar1 = local_1338;
  std::__cxx11::string::string((string *)local_12c8,"help",(allocator *)&local_1328);
  sVar9 = cxxopts::ParseResult::count(&result,(string *)local_12c8);
  std::__cxx11::string::~string((string *)local_12c8);
  if (sVar9 != 0) {
    local_1328._M_dataplus._M_p = (pointer)0x0;
    local_1328._M_string_length = 0;
    local_1328.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_12c8,&options,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1328);
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)local_12c8);
    std::endl<char,std::char_traits<char>>(poVar10);
    std::__cxx11::string::~string((string *)local_12c8);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1328);
    this = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this = &PTR__exception_0021f060;
    pcVar13 = std::exception::~exception;
    ppuVar15 = &HelpException::typeinfo;
    goto LAB_001d0012;
  }
  std::__cxx11::string::string((string *)local_12c8,"font-file",(allocator *)&local_1328);
  sVar9 = cxxopts::ParseResult::count(&result,(string *)local_12c8);
  std::__cxx11::string::~string((string *)local_12c8);
  if (sVar9 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"--font-file required");
  }
  else {
    std::__cxx11::string::string((string *)local_12c8,"output",(allocator *)&local_1328);
    sVar9 = cxxopts::ParseResult::count(&result,(string *)local_12c8);
    std::__cxx11::string::~string((string *)local_12c8);
    if (sVar9 == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"--output required");
    }
    else {
      std::__cxx11::string::string
                ((string *)local_12c8,"max-texture-count",(allocator *)&local_1328);
      sVar9 = cxxopts::ParseResult::count(&result,(string *)local_12c8);
      pCVar1->useMaxTextureCount = sVar9 != 0;
      std::__cxx11::string::~string((string *)local_12c8);
      sVar9 = cxxopts::ParseResult::count(&result,&charsOptionName);
      if ((sVar9 == 0) &&
         (sVar9 = cxxopts::ParseResult::count(&result,&charsFileOptionName), sVar9 == 0)) {
        std::__cxx11::string::assign((char *)&chars);
      }
      std::__cxx11::string::string((string *)&local_d28,(string *)&chars);
      parseCharsString((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_12c8,&local_d28);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::operator=(&(pCVar1->chars)._M_t,
                  (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_12c8);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_12c8);
      std::__cxx11::string::~string((string *)&local_d28);
      sVar9 = cxxopts::ParseResult::count(&result,&charsFileOptionName);
      pbVar4 = charsFile.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      fileName = (string *)
                 charsFile.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (sVar9 != 0) {
        for (; fileName != (string *)pbVar4; fileName = fileName + 1) {
          getCharsFromFile(fileName,&pCVar1->chars);
        }
      }
      CVar6 = parseColor(&color);
      (pCVar1->color).r = (char)CVar6._0_2_;
      (pCVar1->color).g = (char)((ushort)CVar6._0_2_ >> 8);
      (pCVar1->color).b = CVar6.b;
      sVar9 = cxxopts::ParseResult::count(&result,&backgroundColorOptionName);
      pCVar1->backgroundTransparent = sVar9 == 0;
      if (sVar9 != 0) {
        CVar6 = parseColor(&backgroundColor);
        (pCVar1->backgroundColor).r = (char)CVar6._0_2_;
        (pCVar1->backgroundColor).g = (char)((ushort)CVar6._0_2_ >> 8);
        (pCVar1->backgroundColor).b = CVar6.b;
      }
      sVar3 = dataFormat._M_string_length;
      _Var2._M_p = dataFormat._M_dataplus._M_p;
      for (sVar16 = 0; sVar3 != sVar16; sVar16 = sVar16 + 1) {
        iVar7 = tolower((int)_Var2._M_p[sVar16]);
        _Var2._M_p[sVar16] = (char)iVar7;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &dataFormat,"txt");
      if (bVar5) {
        DVar11 = Text;
      }
      else {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&dataFormat,"xml");
        DVar11 = Xml;
        if (!bVar5) {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&dataFormat,"bin");
          if (bVar5) {
            DVar11 = Bin;
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&dataFormat,"json");
            if (bVar5) {
              DVar11 = Json;
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&dataFormat,"cbor");
              if (!bVar5) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"unknown --data-format value");
                goto LAB_001d0004;
              }
              DVar11 = Cbor;
            }
          }
        }
      }
      sVar3 = kerningPairs._M_string_length;
      _Var2._M_p = kerningPairs._M_dataplus._M_p;
      pCVar1->dataFormat = DVar11;
      for (sVar16 = 0; sVar3 != sVar16; sVar16 = sVar16 + 1) {
        iVar7 = tolower((int)_Var2._M_p[sVar16]);
        _Var2._M_p[sVar16] = (char)iVar7;
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &kerningPairs,"disabled");
      TVar14 = IndexAligned;
      KVar12 = Disabled;
      if (!bVar5) {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&kerningPairs,"basic");
        if (bVar5) {
          KVar12 = Basic;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&kerningPairs,"regular");
          if (bVar5) {
            KVar12 = Regular;
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&kerningPairs,"extended");
            if (!bVar5) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"unknown --kerning-pairs value");
              goto LAB_001d0004;
            }
            KVar12 = Extended;
          }
        }
      }
      pCVar1->kerningPairs = KVar12;
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &textureNameSuffix,"index_aligned");
      if (!bVar5) {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&textureNameSuffix,"index");
        if (bVar5) {
          TVar14 = Index;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&textureNameSuffix,"none");
          if (!bVar5) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"unknown --texture-name-suffix value");
            goto LAB_001d0004;
          }
          TVar14 = None;
        }
      }
      pCVar1->textureNameSuffix = TVar14;
      sVar9 = cxxopts::ParseResult::count(&result,&textureSizeListOptionName);
      if (sVar9 == 0) {
        local_12c8._0_8_ = (pointer)0x2000000020;
        local_12c8._8_8_ = (pointer)0x2000000040;
        local_12b8._M_allocated_capacity = 0x4000000040;
        local_12b8._8_8_ = 0x4000000080;
        local_12a8 = (_Base_ptr)0x8000000080;
        sStack_12a0 = 0x8000000100;
        local_1298 = 0x10000000100;
        uStack_1290 = 0x10000000200;
        local_1288 = 0x20000000200;
        uStack_1280 = 0x20000000400;
        local_1278 = 0x400;
        uStack_1274 = 0x400;
        uStack_1270 = 0x800;
        uStack_126c = 0x400;
        local_1268 = 0x80000000800;
        std::vector<Config::Size,std::allocator<Config::Size>>::_M_assign_aux<Config::Size_const*>
                  ((vector<Config::Size,std::allocator<Config::Size>> *)&pCVar1->textureSizeList,
                   local_12c8);
      }
      else {
        parseTextureSize((vector<Config::Size,_std::allocator<Config::Size>_> *)local_12c8,
                         &textureSizeList);
        std::vector<Config::Size,_std::allocator<Config::Size>_>::_M_move_assign
                  (&pCVar1->textureSizeList,
                   (_Vector_base<Config::Size,_std::allocator<Config::Size>_> *)local_12c8);
        std::_Vector_base<Config::Size,_std::allocator<Config::Size>_>::~_Vector_base
                  ((_Vector_base<Config::Size,_std::allocator<Config::Size>_> *)local_12c8);
      }
      if (*local_1330 == 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"invalid --align-horiz");
      }
      else {
        if (local_f50->ver != 0) {
          cxxopts::ParseResult::~ParseResult(&result);
          cxxopts::Options::~Options(&options);
          std::__cxx11::string::~string((string *)&textureNameSuffix);
          std::__cxx11::string::~string((string *)&kerningPairs);
          std::__cxx11::string::~string((string *)&dataFormat);
          std::__cxx11::string::~string((string *)&textureSizeListOptionName);
          std::__cxx11::string::~string((string *)&charsOptionName);
          std::__cxx11::string::~string((string *)&charsFileOptionName);
          std::__cxx11::string::~string((string *)&backgroundColorOptionName);
          std::__cxx11::string::~string((string *)&backgroundColor);
          std::__cxx11::string::~string((string *)&textureSizeList);
          std::__cxx11::string::~string((string *)&color);
          Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&charsFile);
          std::__cxx11::string::~string((string *)&chars);
          return pCVar1;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"invalid --align-vert");
      }
    }
  }
LAB_001d0004:
  pcVar13 = std::runtime_error::~runtime_error;
  ppuVar15 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
LAB_001d0012:
  __cxa_throw(this,ppuVar15,pcVar13);
}

Assistant:

Config ProgramOptions::parseCommandLine(int argc, char* argv[])
{
    try
    {
        Config config;
        std::string chars;
        std::vector<std::string> charsFile;
        std::string color;
        std::string textureSizeList;
        std::string backgroundColor;
        const std::string backgroundColorOptionName = "background-color";
        const std::string charsFileOptionName = "chars-file";
        const std::string charsOptionName = "chars";
        const std::string textureSizeListOptionName = "texture-size";
        std::string dataFormat;
        std::string kerningPairs;
        std::string textureNameSuffix;

        cxxopts::Options options("fontbm", "Command line bitmap font generator, compatible with bmfont");
        options.add_options()
            ("help", "produce help message")
            ("font-file", "path to ttf file, required", cxxopts::value<std::string>(config.fontFile))
            (charsOptionName, "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if 'chars-file' option is not defined", cxxopts::value<std::string>(chars))
            (charsFileOptionName, "optional path to UTF-8 text file with required characters (will be combined with 'chars' option)", cxxopts::value<std::vector<std::string>>(charsFile))
            ("color", "foreground RGB color, for example: 32,255,255, default value is 255,255,255", cxxopts::value<std::string>(color)->default_value("255,255,255"))
            (backgroundColorOptionName, "background color RGB color, for example: 0,0,128, transparent by default", cxxopts::value<std::string>(backgroundColor))
            ("font-size", "font size, default value is 32", cxxopts::value<std::uint16_t>(config.fontSize)->default_value("32"))
            ("padding-up", "padding up, default value is 0", cxxopts::value<std::uint32_t>(config.padding.up)->default_value("0"))
            ("padding-right", "padding right, default value is 0", cxxopts::value<std::uint32_t>(config.padding.right)->default_value("0"))
            ("padding-down", "padding down, default value is 0", cxxopts::value<std::uint32_t>(config.padding.down)->default_value("0"))
            ("padding-left", "padding left, default value is 0", cxxopts::value<std::uint32_t>(config.padding.left)->default_value("0"))
            ("spacing-vert", "spacing vert, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.ver)->default_value("0"))
            ("spacing-horiz", "spacing horiz, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.hor)->default_value("0"))
            ("output", "output files name without extension, required", cxxopts::value<std::string>(config.output))
            ("data-format", R"(output data file format: "txt", "xml", "json", "bin", "cbor", default: "txt")", cxxopts::value<std::string>(dataFormat)->default_value("txt"))
            ("kerning-pairs", R"("generate kerning pairs: "disabled", "basic", "regular" (tuned by hinter), "extended" (bigger output size, but more precise), default: "disabled")", cxxopts::value<std::string>(kerningPairs)->default_value("disabled"))
            ("monochrome", "disable anti-aliasing", cxxopts::value<bool>(config.monochrome))
            ("extra-info", "write extra information to data file", cxxopts::value<bool>(config.extraInfo))
            (textureSizeListOptionName, "list of texture sizes (will be tried from left to right to fit glyphs)", cxxopts::value<std::string>(textureSizeList))
            ("texture-crop-width", "crop unused parts of output textures (width)", cxxopts::value<bool>(config.cropTexturesWidth))
            ("texture-crop-height", "crop unused parts of output textures (height)", cxxopts::value<bool>(config.cropTexturesHeight))
            ("align-horiz", "align glyph horizontal position", cxxopts::value<std::uint32_t>(config.alignment.hor))
            ("align-vert", "align glyph vertical position", cxxopts::value<std::uint32_t>(config.alignment.ver))
            ("verbose", "verbose output", cxxopts::value<bool>(config.verbose))
            ("max-texture-count", "maximum generated textures", cxxopts::value<std::uint32_t>(config.maxTextureCount))
            ("texture-name-suffix", R"(texture name suffix: "index_aligned", "index", "none", default: "index_aligned")", cxxopts::value<std::string>(textureNameSuffix)->default_value("index_aligned"))
            ;

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            throw HelpException();
        }

        if (!result.count("font-file"))
            throw std::runtime_error("--font-file required");
        if (!result.count("output"))
            throw std::runtime_error("--output required");

        config.useMaxTextureCount = result.count("max-texture-count");

        if (!result.count(charsOptionName) && !result.count(charsFileOptionName))
            chars = "32-126";
        config.chars = parseCharsString(chars);
        if (result.count(charsFileOptionName))
            for (const auto& f : charsFile)
                getCharsFromFile(f, config.chars);

        config.color = parseColor(color);
        config.backgroundTransparent = result.count(backgroundColorOptionName) == 0;
        if (!config.backgroundTransparent)
            config.backgroundColor = parseColor(backgroundColor);

        std::transform(dataFormat.begin(), dataFormat.end(), dataFormat.begin(), tolower);

        if (dataFormat == "txt")
            config.dataFormat = Config::DataFormat::Text;
        else if (dataFormat == "xml")
            config.dataFormat = Config::DataFormat::Xml;
        else if (dataFormat == "bin")
            config.dataFormat = Config::DataFormat::Bin;
        else if (dataFormat == "json")
            config.dataFormat = Config::DataFormat::Json;
        else if (dataFormat == "cbor")
            config.dataFormat = Config::DataFormat::Cbor;
        else
            throw std::runtime_error("unknown --data-format value");

        std::transform(kerningPairs.begin(), kerningPairs.end(), kerningPairs.begin(), tolower);
        if (kerningPairs == "disabled")
            config.kerningPairs = Config::KerningPairs::Disabled;
        else if (kerningPairs == "basic")
            config.kerningPairs = Config::KerningPairs::Basic;
        else if (kerningPairs == "regular")
            config.kerningPairs = Config::KerningPairs::Regular;
        else if (kerningPairs == "extended")
            config.kerningPairs = Config::KerningPairs::Extended;
        else
            throw std::runtime_error("unknown --kerning-pairs value");

        if (textureNameSuffix == "index_aligned")
            config.textureNameSuffix = Config::TextureNameSuffix::IndexAligned;
        else if (textureNameSuffix == "index")
            config.textureNameSuffix = Config::TextureNameSuffix::Index;
        else if (textureNameSuffix == "none")
            config.textureNameSuffix = Config::TextureNameSuffix::None;
        else
            throw std::runtime_error("unknown --texture-name-suffix value");

        if (result.count(textureSizeListOptionName))
            config.textureSizeList = parseTextureSize(textureSizeList);
        else
            config.textureSizeList = {
                {32, 32},
                {64, 32},
                {64, 64},
                {128, 64},
                {128, 128},
                {256, 128},
                {256, 256},
                {512, 256},
                {512, 512},
                {1024, 512},
                {1024, 1024},
                {2048, 1024},
                {2048, 2048}
        };

        if (!config.alignment.hor)
            throw std::runtime_error("invalid --align-horiz");
        if (!config.alignment.ver)
            throw std::runtime_error("invalid --align-vert");

        return config;
    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        throw std::exception();
    }
}